

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_find_files.cpp
# Opt level: O1

bool __thiscall crnlib::find_files::find(find_files *this,char *pSpec,uint flags)

{
  bool bVar1;
  bool bVar2;
  char *pFilespec;
  char *pcVar3;
  dynamic_string find_filename;
  dynamic_string find_pathname;
  dynamic_string find_name;
  dynamic_string local_48;
  dynamic_string local_38;
  dynamic_string local_28;
  
  dynamic_string::dynamic_string(&local_28,pSpec);
  bVar1 = file_utils::full_path(&local_28);
  bVar2 = false;
  if (bVar1) {
    local_38.m_buf_size = 0;
    local_38.m_len = 0;
    local_38.m_pStr = (char *)0x0;
    local_48.m_buf_size = 0;
    local_48.m_len = 0;
    local_48.m_pStr = (char *)0x0;
    pcVar3 = local_28.m_pStr;
    if (local_28.m_pStr == (char *)0x0) {
      pcVar3 = "";
    }
    bVar1 = file_utils::split_path(pcVar3,&local_38,&local_48);
    if (bVar1) {
      pcVar3 = local_38.m_pStr;
      if (local_38.m_pStr == (char *)0x0) {
        pcVar3 = "";
      }
      pFilespec = local_48.m_pStr;
      if (local_48.m_pStr == (char *)0x0) {
        pFilespec = "";
      }
      bVar2 = find(this,pcVar3,pFilespec,flags);
    }
    else {
      bVar2 = false;
    }
    if ((local_48.m_pStr != (char *)0x0) &&
       ((*(uint *)(local_48.m_pStr + -8) ^ *(uint *)(local_48.m_pStr + -4)) == 0xffffffff)) {
      crnlib_free(local_48.m_pStr + -0x10);
    }
    if ((local_38.m_pStr != (char *)0x0) &&
       ((*(uint *)(local_38.m_pStr + -8) ^ *(uint *)(local_38.m_pStr + -4)) == 0xffffffff)) {
      crnlib_free(local_38.m_pStr + -0x10);
    }
  }
  if ((local_28.m_pStr != (char *)0x0) &&
     ((*(uint *)(local_28.m_pStr + -8) ^ *(uint *)(local_28.m_pStr + -4)) == 0xffffffff)) {
    crnlib_free(local_28.m_pStr + -0x10);
  }
  return bVar2;
}

Assistant:

bool find_files::find(const char* pSpec, uint flags)
    {
        dynamic_string find_name(pSpec);

        if (!file_utils::full_path(find_name))
        {
            return false;
        }

        dynamic_string find_pathname, find_filename;
        if (!file_utils::split_path(find_name.get_ptr(), find_pathname, find_filename))
        {
            return false;
        }

        return find(find_pathname.get_ptr(), find_filename.get_ptr(), flags);
    }